

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::is_non_native_row_major_matrix(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRType *pSVar2;
  CompilerError *this_00;
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  SPIRType type;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  type.member_name_cache._M_h._M_single_bucket._4_4_ = id;
  if ((((this->backend).native_row_major_matrix & 1U) != 0) && (bVar1 = is_legacy(this), !bVar1)) {
    return false;
  }
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)&type.member_name_cache._M_h._M_single_bucket,
             type.member_name_cache._M_h._M_single_bucket._4_4_);
  bVar1 = Compiler::has_decoration
                    (&this->super_Compiler,type.member_name_cache._M_h._M_single_bucket._0_4_,
                     DecorationRowMajor);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pSVar2 = Compiler::expression_type
                       (&this->super_Compiler,type.member_name_cache._M_h._M_single_bucket._4_4_);
    SPIRType::SPIRType((SPIRType *)local_170,pSVar2);
    if (type.width != type.super_IVariant._12_4_) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_190,"Row-major matrices must be square on this platform.",&local_191);
      CompilerError::CompilerError(this_00,(string *)local_190);
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this_local._7_1_ = true;
    SPIRType::~SPIRType((SPIRType *)local_170);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::is_non_native_row_major_matrix(uint32_t id)
{
	// Natively supported row-major matrices do not need to be converted.
	// Legacy targets do not support row major.
	if (backend.native_row_major_matrix && !is_legacy())
		return false;

	// Non-matrix or column-major matrix types do not need to be converted.
	if (!has_decoration(id, DecorationRowMajor))
		return false;

	// Only square row-major matrices can be converted at this time.
	// Converting non-square matrices will require defining custom GLSL function that
	// swaps matrix elements while retaining the original dimensional form of the matrix.
	const auto type = expression_type(id);
	if (type.columns != type.vecsize)
		SPIRV_CROSS_THROW("Row-major matrices must be square on this platform.");

	return true;
}